

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  long lVar1;
  uint *puVar2;
  int iVar3;
  long in_FS_OFFSET;
  char zPwd [4098];
  DbPath local_1048;
  char local_1028 [4104];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_1048.rc = 0;
  local_1048.nSymlink = 0;
  local_1048.nUsed = 0;
  local_1048.zOut = zOut;
  local_1048.nOut = nOut;
  if (*zPath != '/') {
    memset(local_1028,0xaa,0x1002);
    lVar1 = (*aSyscall[3].pCurrent)(local_1028,0x1000);
    if (lVar1 == 0) {
      sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xb0fc,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      puVar2 = (uint *)__errno_location();
      sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0xb0fc,(ulong)*puVar2,"getcwd",zPath,"");
      iVar3 = 0xe;
      goto LAB_0012123d;
    }
    appendAllPathElements(&local_1048,local_1028);
  }
  appendAllPathElements(&local_1048,zPath);
  zOut[local_1048.nUsed] = '\0';
  if (((long)local_1048.nUsed < 2) || (local_1048.rc != 0)) {
    iVar3 = 0xe;
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xb102,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  else {
    iVar3 = (uint)(local_1048.nSymlink != 0) << 9;
  }
LAB_0012123d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
  DbPath path;
  UNUSED_PARAMETER(pVfs);
  path.rc = 0;
  path.nUsed = 0;
  path.nSymlink = 0;
  path.nOut = nOut;
  path.zOut = zOut;
  if( zPath[0]!='/' ){
    char zPwd[SQLITE_MAX_PATHLEN+2];
    if( osGetcwd(zPwd, sizeof(zPwd)-2)==0 ){
      return unixLogError(SQLITE_CANTOPEN_BKPT, "getcwd", zPath);
    }
    appendAllPathElements(&path, zPwd);
  }
  appendAllPathElements(&path, zPath);
  zOut[path.nUsed] = 0;
  if( path.rc || path.nUsed<2 ) return SQLITE_CANTOPEN_BKPT;
  if( path.nSymlink ) return SQLITE_OK_SYMLINK;
  return SQLITE_OK;
}